

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testClassification.cpp
# Opt level: O1

void anon_unknown.dwarf_8f0e::testClass
               (half h,bool finite,bool normalized,bool denormalized,bool zero,bool nan,
               bool infinity,bool negative)

{
  long lVar1;
  ushort uVar2;
  ostream *poVar3;
  ushort uVar4;
  ushort uVar5;
  bool bVar6;
  bool bVar7;
  
  lVar1 = std::cout;
  *(undefined8 *)(printBits + *(long *)(std::cout + -0x18)) = 0xf;
  *(undefined8 *)(operator_delete__ + *(long *)(lVar1 + -0x18)) = 8;
  poVar3 = (ostream *)operator<<((ostream *)&std::cout,h);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"    ",4);
  printBits((ostream *)&std::cout,h);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"    ",4);
  uVar5 = h._h & 0x7c00;
  if (uVar5 != 0x7c00) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"finite ",7);
  }
  uVar2 = h._h >> 10 & 0x1f;
  if (((h._h & 0x7c00) != 0) && (uVar2 != 0x1f)) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"normalized ",0xb);
  }
  bVar6 = (h._h & 0x3ff) != 0;
  if (bVar6 && uVar5 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"denormalized ",0xd);
  }
  uVar4 = h._h & 0x7fff;
  if (uVar4 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"zero ",5);
  }
  bVar7 = (h._h & 0x3ff) != 0;
  if (uVar5 == 0x7c00 && bVar7) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"nan ",4);
  }
  if (uVar4 == 0x7c00) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"infinity ",9);
  }
  if ((short)h._h < 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"negative ",9);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  if ((uVar5 != 0x7c00) != finite) {
    __assert_fail("h.isFinite() == finite",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/HalfTest/testClassification.cpp"
                  ,0x40,
                  "void (anonymous namespace)::testClass(half, bool, bool, bool, bool, bool, bool, bool)"
                 );
  }
  if (((h._h & 0x7c00) != 0 && uVar2 != 0x1f) != normalized) {
    __assert_fail("h.isNormalized() == normalized",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/HalfTest/testClassification.cpp"
                  ,0x41,
                  "void (anonymous namespace)::testClass(half, bool, bool, bool, bool, bool, bool, bool)"
                 );
  }
  if ((bVar6 && uVar5 == 0) != denormalized) {
    __assert_fail("h.isDenormalized() == denormalized",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/HalfTest/testClassification.cpp"
                  ,0x42,
                  "void (anonymous namespace)::testClass(half, bool, bool, bool, bool, bool, bool, bool)"
                 );
  }
  if ((uVar4 == 0) != zero) {
    __assert_fail("h.isZero() == zero",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/HalfTest/testClassification.cpp"
                  ,0x43,
                  "void (anonymous namespace)::testClass(half, bool, bool, bool, bool, bool, bool, bool)"
                 );
  }
  if ((uVar5 == 0x7c00 && bVar7) != nan) {
    __assert_fail("h.isNan() == nan",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/HalfTest/testClassification.cpp"
                  ,0x44,
                  "void (anonymous namespace)::testClass(half, bool, bool, bool, bool, bool, bool, bool)"
                 );
  }
  if ((uVar4 == 0x7c00) != infinity) {
    __assert_fail("h.isInfinity() == infinity",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/HalfTest/testClassification.cpp"
                  ,0x45,
                  "void (anonymous namespace)::testClass(half, bool, bool, bool, bool, bool, bool, bool)"
                 );
  }
  if ((short)h._h < 0 == negative) {
    return;
  }
  __assert_fail("h.isNegative() == negative",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/HalfTest/testClassification.cpp"
                ,0x46,
                "void (anonymous namespace)::testClass(half, bool, bool, bool, bool, bool, bool, bool)"
               );
}

Assistant:

void
testClass (half h,
	   bool finite,
	   bool normalized,
	   bool denormalized,
	   bool zero,
	   bool nan,
	   bool infinity,
	   bool negative)
{
    cout.width (15);
    cout.precision (8);

    cout << h << "    ";
    printBits (cout, h);
    cout << "    ";

    if (h.isFinite())
	cout << "finite ";

    if (h.isNormalized())
	cout << "normalized ";

    if (h.isDenormalized())
	cout << "denormalized ";

    if (h.isZero())
	cout << "zero ";

    if (h.isNan())
	cout << "nan ";

    if (h.isInfinity())
	cout << "infinity ";

    if (h.isNegative())
	cout << "negative ";

    cout << endl;

    assert (h.isFinite() == finite);
    assert (h.isNormalized() == normalized);
    assert (h.isDenormalized() == denormalized);
    assert (h.isZero() == zero);
    assert (h.isNan() == nan);
    assert (h.isInfinity() == infinity);
    assert (h.isNegative() == negative);
}